

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tools_class.cpp
# Opt level: O2

void __thiscall test_tools::test_nullable::test_method(test_nullable *this)

{
  unit_test_log_t *puVar1;
  undefined4 local_158;
  int b;
  undefined8 local_150;
  nullable_int c;
  unit_test_log_t local_140;
  undefined1 local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload.
  _M_value = 0x32f;
  c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_engaged =
       true;
  local_150 = 0x100001267;
  b = 0x1267;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x25,&local_50);
  puVar1 = &local_140;
  local_138 = 0;
  local_140.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00176b40;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_58 = "";
  local_158 = 0xd;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,std::optional<int>,int>
            (puVar1,&local_60,0x25,1,3,&local_150,"a",&local_158,"13");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_70,0x26,&local_80);
  local_138 = 0;
  local_140.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00176b40;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_88 = "";
  local_158 = 0x1267;
  puVar1 = &local_140;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<int>,int>
            (puVar1,&local_90,0x26,1,2,&local_150,"a",&local_158,"4711");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a0,0x27,&local_b0);
  local_138 = 0;
  local_140.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00176b40;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_b8 = "";
  puVar1 = &local_140;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,std::optional<int>>
            (puVar1,&local_c0,0x27,1,2,&b,"b",&local_150,"a");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_d0,0x28,&local_e0);
  local_138 = 0;
  local_140.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00176b40;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_e8 = "";
  local_158 = 0x1267;
  puVar1 = &local_140;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (puVar1,&local_f0,0x28,1,2,&b,"b",&local_158,"4711");
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_100,0x29,&local_110);
  local_138 = 0;
  local_140.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00176b40;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_118 = "";
  local_158 = 0x32f;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<int>,int>
            (&local_140,&local_120,0x29,1,2,&c,"c",&local_158,"815");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_nullable)
{
    tools::nullable_int a, c(815);

    a = 4711;

    int b = a.value();

    BOOST_CHECK_NE(a, 13);
    BOOST_CHECK_EQUAL(a, 4711);
    BOOST_CHECK_EQUAL(b, a);
    BOOST_CHECK_EQUAL(b, 4711);
    BOOST_CHECK_EQUAL(c, 815);
}